

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.h
# Opt level: O0

void __thiscall SGParser::Generator::Grammar::Grammar(Grammar *this)

{
  Grammar *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map(&this->GrammarSymbols);
  std::
  map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  ::map(&this->GrammarSymbolsInv);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->GrammarSymbolList);
  std::
  map<unsigned_int,_std::vector<SGParser::Generator::ParseTableProduction,_std::allocator<SGParser::Generator::ParseTableProduction>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<SGParser::Generator::ParseTableProduction,_std::allocator<SGParser::Generator::ParseTableProduction>_>_>_>_>
  ::map(&this->Productions);
  this->ProductionCount = 0;
  std::
  map<unsigned_int,_SGParser::Generator::Grammar::TerminalPrec,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Grammar::TerminalPrec>_>_>
  ::map(&this->Precedence);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->StartSymbols);
  GrammarDebugData::GrammarDebugData(&this->DebugData);
  ParseMessageBuffer::ParseMessageBuffer(&this->Messages);
  return;
}

Assistant:

Grammar() = default;